

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::Array2D<float>::Array2D(Array2D<float> *this,Bounds2i *extent,Allocator allocator)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  float *pfVar2;
  uint uVar3;
  ulong uVar4;
  polymorphic_allocator<std::byte> local_18;
  
  TVar1 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
       (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar1;
  (this->allocator).memoryResource = allocator.memoryResource;
  uVar3 = ((extent->pMax).super_Tuple2<pbrt::Point2,_int>.y -
          (extent->pMin).super_Tuple2<pbrt::Point2,_int>.y) *
          ((extent->pMax).super_Tuple2<pbrt::Point2,_int>.x -
          (extent->pMin).super_Tuple2<pbrt::Point2,_int>.x);
  local_18.memoryResource = allocator.memoryResource;
  pfVar2 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<float>
                     (&local_18,(long)(int)uVar3);
  this->values = pfVar2;
  for (uVar4 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar4; uVar4 = uVar4 + 1) {
    pfVar2[uVar4] = 0.0;
  }
  return;
}

Assistant:

Array2D(const Bounds2i &extent, Allocator allocator = {})
        : extent(extent), allocator(allocator) {
        int n = extent.Area();
        values = allocator.allocate_object<T>(n);
        for (int i = 0; i < n; ++i)
            allocator.construct(values + i);
    }